

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O1

void rt_shaded1col(int hx,int sx,int yl,int yh)

{
  lighttable_t *plVar1;
  BYTE *pBVar2;
  long lVar3;
  uint uVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  
  pBVar2 = dc_temp;
  plVar1 = dc_colormap;
  if (-1 < yh - yl) {
    lVar3 = (long)dc_color;
    pbVar5 = dc_destorg + (long)sx + (long)ylookup[yl];
    lVar6 = (long)dc_pitch;
    lVar7 = 0;
    do {
      uVar4 = Col2RGB8[0x40 - plVar1[pBVar2[lVar7 * 4 + (long)(hx + yl * 4)]]][*pbVar5] +
              Col2RGB8[plVar1[pBVar2[lVar7 * 4 + (long)(hx + yl * 4)]]][lVar3] | 0x1f07c1f;
      *pbVar5 = RGB32k.All[uVar4 >> 0xf & uVar4];
      pbVar5 = pbVar5 + lVar6;
      lVar7 = lVar7 + 1;
    } while ((yh - yl) + 1 != (int)lVar7);
  }
  return;
}

Assistant:

void rt_shaded1col (int hx, int sx, int yl, int yh)
{
	DWORD *fgstart;
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	fgstart = &Col2RGB8[0][dc_color];
	colormap = dc_colormap;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4 + hx];
	pitch = dc_pitch;

	do {
		DWORD val = colormap[*source];
		DWORD fg = fgstart[val<<8];
		val = (Col2RGB8[64-val][*dest] + fg) | 0x1f07c1f;
		*dest = RGB32k.All[val & (val>>15)];
		source += 4;
		dest += pitch;
	} while (--count);
}